

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastGtS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  uint32_t uVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  MessageLite *pMVar6;
  ulong uVar7;
  char *pcVar8;
  ushort *puVar9;
  Nonnull<const_char_*> failure_msg;
  int iVar10;
  ushort *puVar11;
  uint *puVar12;
  Arena *arena;
  int iVar13;
  TcParseTableBase *unaff_R13;
  long *plVar14;
  ushort *local_60 [2];
  uint32_t local_4c;
  ulong local_48;
  MessageLite *msg_00;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar8 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar8;
  }
  bVar1 = *ptr;
  if ((ulong)table->has_bits_offset != 0) {
    puVar12 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar12 & 3) != 0) {
      AlignFail(puVar12);
    }
    *puVar12 = *puVar12 | (uint)hasbits | (uint)(1L << (data.field_0._2_1_ & 0x3f));
  }
  plVar14 = (long *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)plVar14 & 7) != 0) {
    AlignFail(plVar14);
  }
  lVar3 = *(long *)((long)&table->has_bits_offset +
                   ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  pMVar6 = (MessageLite *)*plVar14;
  if (pMVar6 == (MessageLite *)0x0) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar6 = ClassData::New(*(ClassData **)(lVar3 + 0x20),arena);
    *plVar14 = (long)pMVar6;
  }
  local_48 = (ulong)ctx->depth_;
  msg_00 = (MessageLite *)(local_48 - 1);
  ctx->depth_ = (int)msg_00;
  if ((long)local_48 < 1) {
    return (char *)0x0;
  }
  local_4c = (uint32_t)bVar1;
  local_60[0] = (ushort *)(ptr + 1);
  iVar10 = ctx->group_depth_;
  iVar13 = (int)((long)iVar10 + 1);
  ctx->group_depth_ = iVar13;
  while (bVar4 = EpsCopyInputStream::DoneWithCheck<false>
                           (&ctx->super_EpsCopyInputStream,(char **)local_60,ctx->group_depth_),
        !bVar4) {
    uVar5 = (uint)*(byte *)(lVar3 + 8) & (uint)*local_60[0];
    if ((uVar5 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar7 = (ulong)(uVar5 & 0xfffffff8);
    local_60[0] = (ushort *)
                  (**(code **)(lVar3 + 0x38 + uVar7 * 2))
                            (pMVar6,local_60[0],ctx,
                             (ulong)*local_60[0] ^ *(ulong *)(lVar3 + 0x40 + uVar7 * 2),lVar3,0);
    if ((local_60[0] == (ushort *)0x0) || ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0))
    break;
  }
  if ((*(byte *)(lVar3 + 9) & 1) == 0) {
    puVar9 = local_60[0];
    if (local_60[0] == (ushort *)0x0) {
      VerifyHasBitConsistency(msg_00,unaff_R13);
      puVar9 = local_60[0];
      goto LAB_00f76dcf;
    }
  }
  else {
    puVar9 = (ushort *)(**(code **)(lVar3 + 0x28))(pMVar6,local_60[0],ctx);
LAB_00f76dcf:
    if (puVar9 == (ushort *)0x0) {
      iVar10 = ctx->group_depth_ + -1;
      local_48 = (ulong)(ctx->depth_ + 1);
      puVar9 = (ushort *)0x0;
      goto LAB_00f76d2a;
    }
  }
  if ((int)msg_00 == ctx->depth_) {
    if (iVar13 == ctx->group_depth_) {
LAB_00f76d2a:
      ctx->group_depth_ = iVar10;
      ctx->depth_ = (int)local_48;
      uVar2 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
      puVar11 = (ushort *)0x0;
      if (uVar2 == local_4c) {
        puVar11 = puVar9;
      }
      return (char *)puVar11;
    }
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar10 + 1,(long)ctx->group_depth_,
                             "old_group_depth == group_depth_");
    iVar10 = 0x492;
  }
  else {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)msg_00,(long)ctx->depth_,"old_depth == depth_");
    iVar10 = 0x491;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
             ,iVar10,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_60);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGtS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint8_t, true, true>(
      PROTOBUF_TC_PARAM_PASS);
}